

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O0

void do_cmd_wiz_peek_noise_scent(command_conflict *cmd)

{
  _Bool _Var1;
  char *pcVar2;
  char local_15;
  uint local_14;
  char kp;
  command_conflict *pcStack_10;
  wchar_t i;
  command_conflict *cmd_local;
  
  pcStack_10 = cmd;
  for (local_14 = 0; (int)local_14 < 100; local_14 = local_14 + 1) {
    wiz_hack_map((chunk *)cave,player,wiz_hack_map_peek_noise,&local_14);
    pcVar2 = format("Depth %d: ",(ulong)local_14);
    _Var1 = get_com(pcVar2,&local_15);
    if (!_Var1) break;
    prt_map();
  }
  for (local_14 = 0; (int)local_14 < 0x32; local_14 = local_14 + 1) {
    wiz_hack_map((chunk *)cave,player,wiz_hack_map_peek_scent,&local_14);
    pcVar2 = format("Depth %d: ",(ulong)local_14);
    _Var1 = get_com(pcVar2,&local_15);
    if (!_Var1) break;
    prt_map();
  }
  prt("",L'\0',L'\0');
  prt_map();
  return;
}

Assistant:

void do_cmd_wiz_peek_noise_scent(struct command *cmd)
{
	int i;
	char kp;

	/* Noise */
	for (i = 0; i < 100; i++) {
		wiz_hack_map(cave, player, wiz_hack_map_peek_noise, &i);

		/* Get key */
		if (!get_com(format("Depth %d: ", i), &kp)) break;

		/* Redraw map */
		prt_map();
	}

	/* Smell */
	for (i = 0; i < 50; i++) {
		wiz_hack_map(cave, player, wiz_hack_map_peek_scent, &i);

		/* Get key */
		if (!get_com(format("Depth %d: ", i), &kp)) break;

		/* Redraw map */
		prt_map();
	}

	/* Done */
	prt("", 0, 0);

	/* Redraw map */
	prt_map();
}